

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall
amrex::FabArrayBase::CPC::CPC
          (CPC *this,BoxArray *dstba,DistributionMapping *dstdm,
          Vector<int,_std::allocator<int>_> *dstidx,IntVect *dstng,BoxArray *srcba,
          DistributionMapping *srcdm,Vector<int,_std::allocator<int>_> *srcidx,IntVect *srcng,
          Periodicity *period,int myproc)

{
  long in_RDI;
  undefined8 *in_R8;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  DistributionMapping *in_stack_000005b8;
  BoxArray *in_stack_000005c0;
  Vector<int,_std::allocator<int>_> *in_stack_000005c8;
  DistributionMapping *in_stack_000005d0;
  BoxArray *in_stack_000005d8;
  CPC *in_stack_000005e0;
  Vector<int,_std::allocator<int>_> *in_stack_00000610;
  int in_stack_00000618;
  BoxArray *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  
  CommMetaData::CommMetaData
            ((CommMetaData *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  BDKey::BDKey((BDKey *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  BDKey::BDKey((BDKey *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  *(undefined4 *)(in_RDI + 0x48) = *(undefined4 *)(in_stack_00000018 + 1);
  *(undefined8 *)(in_RDI + 0x40) = *in_stack_00000018;
  *(undefined4 *)(in_RDI + 0x54) = *(undefined4 *)(in_R8 + 1);
  *(undefined8 *)(in_RDI + 0x4c) = *in_R8;
  *(undefined4 *)(in_RDI + 0x60) = *(undefined4 *)(in_stack_00000020 + 1);
  *(undefined8 *)(in_RDI + 0x58) = *in_stack_00000020;
  *(undefined1 *)(in_RDI + 100) = 0;
  BoxArray::BoxArray((BoxArray *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  BoxArray::BoxArray((BoxArray *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  *(undefined8 *)(in_RDI + 0x138) = 0;
  define(in_stack_000005e0,in_stack_000005d8,in_stack_000005d0,in_stack_000005c8,in_stack_000005c0,
         in_stack_000005b8,in_stack_00000610,in_stack_00000618);
  return;
}

Assistant:

FabArrayBase::CPC::CPC (const BoxArray& dstba, const DistributionMapping& dstdm,
                        const Vector<int>& dstidx, const IntVect& dstng,
                        const BoxArray& srcba, const DistributionMapping& srcdm,
                        const Vector<int>& srcidx, const IntVect& srcng,
                        const Periodicity& period, int myproc)
    : m_srcbdk(),
      m_dstbdk(),
      m_srcng(srcng),
      m_dstng(dstng),
      m_period(period),
      m_tgco(false),
      m_srcba(srcba),
      m_dstba(dstba),
      m_nuse(0)
{
    this->define(dstba, dstdm, dstidx, srcba, srcdm, srcidx, myproc);
}